

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# potion.c
# Opt level: O0

int dodip(obj *potion)

{
  boolean bVar1;
  char cVar2;
  obj *obj_00;
  char *pcVar3;
  char *pcVar4;
  char local_b8 [8];
  char qbuf [128];
  char local_2b [3];
  char allowall [2];
  char *pcStack_28;
  uchar here;
  char *tmp;
  obj *obj;
  obj *potion_local;
  
  local_2b[0] = '\x14';
  local_2b[1] = '\0';
  if ((potion == (obj *)0x0) || (bVar1 = validate_object(potion,"\b","dip into"), bVar1 != '\0')) {
    obj_00 = getobj(local_2b,"dip",(obj **)0x0);
    if (obj_00 == (obj *)0x0) {
      potion_local._4_4_ = 0;
    }
    else {
      obj = potion;
      if (potion == (obj *)0x0) {
        local_2b[2] = level->locations[u.ux][u.uy].typ;
        if (local_2b[2] == '\x1c') {
          pcVar3 = xname(obj_00);
          pcVar3 = the(pcVar3);
          pcVar4 = simple_typename((int)obj_00->otyp);
          pcVar4 = the(pcVar4);
          pcVar3 = safe_qbuf("",0x18,pcVar3,pcVar4,"this item");
          sprintf(local_b8,"Dip %s into the fountain?",pcVar3);
          cVar2 = yn_function(local_b8,"yn",'n');
          if (cVar2 == 'y') {
            dipfountain(obj_00);
            return 1;
          }
        }
        else {
          bVar1 = is_pool(level,(int)u.ux,(int)u.uy);
          if ((bVar1 != '\0') || (bVar1 = is_swamp(level,(int)u.ux,(int)u.uy), bVar1 != '\0')) {
            pcStack_28 = waterbody_name(u.ux,u.uy);
            pcVar3 = xname(obj_00);
            pcVar3 = the(pcVar3);
            pcVar4 = simple_typename((int)obj_00->otyp);
            pcVar4 = the(pcVar4);
            pcVar3 = safe_qbuf("",0x1d,pcVar3,pcVar4,"this item");
            sprintf(local_b8,"Dip %s into the %s?",pcVar3,pcStack_28);
            cVar2 = yn_function(local_b8,"yn",'n');
            if (cVar2 == 'y') {
              if (((u.uprops[0x12].intrinsic == 0) && (u.uprops[0x12].extrinsic == 0)) &&
                 ((youmonst.data)->mlet != '\x05')) {
                if (((u.usteed == (monst *)0x0) || (((u.usteed)->data->mflags1 & 2) != 0)) ||
                   ('\x01' < u.weapon_skills[0x27].skill)) {
                  get_wet(obj_00);
                  if (obj_00->otyp == 0x141) {
                    useup(obj_00);
                  }
                }
                else {
                  rider_cant_reach();
                }
              }
              else {
                floating_above(pcStack_28);
              }
              return 1;
            }
          }
        }
        pcVar3 = xname(obj_00);
        pcVar3 = the(pcVar3);
        pcVar4 = simple_typename((int)obj_00->otyp);
        pcVar4 = the(pcVar4);
        pcVar3 = safe_qbuf("",10,pcVar3,pcVar4,"this item");
        sprintf(local_b8,"dip %s into",pcVar3);
        obj = getobj("\b",local_b8,(obj **)0x0);
      }
      if (obj == (obj *)0x0) {
        potion_local._4_4_ = 0;
      }
      else if ((obj == obj_00) && (obj->quan == 1)) {
        pline("That is a potion bottle, not a Klein bottle!");
        potion_local._4_4_ = 0;
      }
      else {
        potion_local._4_4_ = dip(obj,obj_00);
      }
    }
  }
  else {
    potion_local._4_4_ = 0;
  }
  return potion_local._4_4_;
}

Assistant:

int dodip(struct obj *potion)
{
	struct obj *obj;
	const char *tmp;
	uchar here;
	char allowall[2] = {ALL_CLASSES, 0};
	char qbuf[QBUFSZ];

	if (potion && !validate_object(potion, beverages, "dip into"))
		return 0;
	
	obj = getobj(allowall, "dip", NULL);
	if (!obj) return 0;

	if (!potion) {
		here = level->locations[u.ux][u.uy].typ;
		/* Is there a fountain to dip into here? */
		if (IS_FOUNTAIN(here)) {
			sprintf(qbuf, "Dip %s into the fountain?",
				safe_qbuf("", sizeof("Dip  into the fountain?"),
					  the(xname(obj)),
					  the(simple_typename(obj->otyp)),
					  "this item"));
			if (yn(qbuf) == 'y') {
				dipfountain(obj);
				return 1;
			}
		} else if (is_pool(level, u.ux,u.uy) || is_swamp(level, u.ux,u.uy)) {
			tmp = waterbody_name(u.ux,u.uy);
			sprintf(qbuf, "Dip %s into the %s?",
				safe_qbuf("",
					  sizeof("Dip  into the pool of water?"),
					  the(xname(obj)),
					  the(simple_typename(obj->otyp)),
					  "this item"),
				tmp);
			if (yn(qbuf) == 'y') {
			    if (Levitation) {
				floating_above(tmp);
			    } else if (u.usteed && !is_swimmer(u.usteed->data) &&
				    P_SKILL(P_RIDING) < P_BASIC) {
				rider_cant_reach(); /* not skilled enough to reach */
			    } else {
				get_wet(obj);
				if (obj->otyp == POT_ACID) useup(obj);
			    }
			    return 1;
			}
		}
		sprintf(qbuf, "dip %s into",
			safe_qbuf("", sizeof("dip  into"),
				  the(xname(obj)),
				  the(simple_typename(obj->otyp)),
				  "this item"));
		potion = getobj(beverages, qbuf, NULL);
	}

	if (!potion) return 0;
	if (potion == obj && potion->quan == 1L) {
		pline("That is a potion bottle, not a Klein bottle!");
		return 0;
	}

	return dip(potion, obj);
}